

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp3.c
# Opt level: O3

void G3_Ev(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UIntPtr UVar3;
  ulong uVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  Int32 IVar15;
  
  UVar3 = (pMyDisasm->Reserved_).EIP_;
  uVar4 = (pMyDisasm->Reserved_).EndOfBlock;
  if (uVar4 < UVar3 + 2 && uVar4 != 0) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
  }
  else {
    uVar12 = *(byte *)(UVar3 + 1) >> 3 & 7;
    (pMyDisasm->Reserved_).REGOPCODE = uVar12;
    switch(uVar12) {
    default:
      (pMyDisasm->Instruction).Category = 0x10005;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"test",5);
      EvIv(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 1;
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x68].SF_;
      UVar6 = EFLAGS_TABLE[0x68].ZF_;
      UVar7 = EFLAGS_TABLE[0x68].AF_;
      UVar8 = EFLAGS_TABLE[0x68].PF_;
      UVar9 = EFLAGS_TABLE[0x68].CF_;
      UVar10 = EFLAGS_TABLE[0x68].TF_;
      UVar11 = EFLAGS_TABLE[0x68].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x68].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      uVar14 = EFLAGS_TABLE[0x68]._8_4_;
      break;
    case 2:
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"not",4);
      iVar13 = (pMyDisasm->Reserved_).OperandSize;
      uVar12 = 4;
      if (iVar13 != 0x40) {
        uVar12 = iVar13 == 0x20 | 2;
      }
      (pMyDisasm->Reserved_).MemDecoration = uVar12;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).AccessMode = 3;
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x49].SF_;
      UVar6 = EFLAGS_TABLE[0x49].ZF_;
      UVar7 = EFLAGS_TABLE[0x49].AF_;
      UVar8 = EFLAGS_TABLE[0x49].PF_;
      UVar9 = EFLAGS_TABLE[0x49].CF_;
      UVar10 = EFLAGS_TABLE[0x49].TF_;
      UVar11 = EFLAGS_TABLE[0x49].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x49].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      uVar14 = EFLAGS_TABLE[0x49]._8_4_;
      break;
    case 3:
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"neg",4);
      iVar13 = (pMyDisasm->Reserved_).OperandSize;
      uVar12 = 4;
      if (iVar13 != 0x40) {
        uVar12 = iVar13 == 0x20 | 2;
      }
      (pMyDisasm->Reserved_).MemDecoration = uVar12;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).AccessMode = 3;
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x47].SF_;
      UVar6 = EFLAGS_TABLE[0x47].ZF_;
      UVar7 = EFLAGS_TABLE[0x47].AF_;
      UVar8 = EFLAGS_TABLE[0x47].PF_;
      UVar9 = EFLAGS_TABLE[0x47].CF_;
      UVar10 = EFLAGS_TABLE[0x47].TF_;
      UVar11 = EFLAGS_TABLE[0x47].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x47].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      uVar14 = EFLAGS_TABLE[0x47]._8_4_;
      break;
    case 4:
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"mul",4);
      iVar13 = (pMyDisasm->Reserved_).OperandSize;
      if (iVar13 == 0x40) {
        IVar15 = 0x68;
      }
      else if (iVar13 == 0x20) {
        IVar15 = 0x67;
      }
      else {
        iVar13 = 0x10;
        IVar15 = 0x66;
      }
      (pMyDisasm->Reserved_).MemDecoration = IVar15;
      (pMyDisasm->Operand1).OpSize = iVar13;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x46].SF_;
      UVar6 = EFLAGS_TABLE[0x46].ZF_;
      UVar7 = EFLAGS_TABLE[0x46].AF_;
      UVar8 = EFLAGS_TABLE[0x46].PF_;
      UVar9 = EFLAGS_TABLE[0x46].CF_;
      UVar10 = EFLAGS_TABLE[0x46].TF_;
      UVar11 = EFLAGS_TABLE[0x46].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x46].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      uVar14 = EFLAGS_TABLE[0x46]._8_4_;
      break;
    case 5:
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"imul",5);
      iVar13 = (pMyDisasm->Reserved_).OperandSize;
      if (iVar13 == 0x40) {
        IVar15 = 0x68;
      }
      else if (iVar13 == 0x20) {
        IVar15 = 0x67;
      }
      else {
        iVar13 = 0x10;
        IVar15 = 0x66;
      }
      (pMyDisasm->Reserved_).MemDecoration = IVar15;
      (pMyDisasm->Operand1).OpSize = iVar13;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 1;
      (pMyDisasm->Operand1).AccessMode = 3;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x26].SF_;
      UVar6 = EFLAGS_TABLE[0x26].ZF_;
      UVar7 = EFLAGS_TABLE[0x26].AF_;
      UVar8 = EFLAGS_TABLE[0x26].PF_;
      UVar9 = EFLAGS_TABLE[0x26].CF_;
      UVar10 = EFLAGS_TABLE[0x26].TF_;
      UVar11 = EFLAGS_TABLE[0x26].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x26].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      uVar14 = EFLAGS_TABLE[0x26]._8_4_;
      break;
    case 6:
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"div",4);
      iVar13 = (pMyDisasm->Reserved_).OperandSize;
      if (iVar13 == 0x40) {
        IVar15 = 0x68;
      }
      else if (iVar13 == 0x20) {
        IVar15 = 0x67;
      }
      else {
        iVar13 = 0x10;
        IVar15 = 0x66;
      }
      (pMyDisasm->Reserved_).MemDecoration = IVar15;
      (pMyDisasm->Operand1).OpSize = iVar13;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x1f].SF_;
      UVar6 = EFLAGS_TABLE[0x1f].ZF_;
      UVar7 = EFLAGS_TABLE[0x1f].AF_;
      UVar8 = EFLAGS_TABLE[0x1f].PF_;
      UVar9 = EFLAGS_TABLE[0x1f].CF_;
      UVar10 = EFLAGS_TABLE[0x1f].TF_;
      UVar11 = EFLAGS_TABLE[0x1f].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x1f].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      uVar14 = EFLAGS_TABLE[0x1f]._8_4_;
      break;
    case 7:
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"idiv",5);
      iVar13 = (pMyDisasm->Reserved_).OperandSize;
      if (iVar13 == 0x40) {
        IVar15 = 0x68;
      }
      else if (iVar13 == 0x20) {
        IVar15 = 0x67;
      }
      else {
        iVar13 = 0x10;
        IVar15 = 0x66;
      }
      (pMyDisasm->Reserved_).MemDecoration = IVar15;
      (pMyDisasm->Operand1).OpSize = iVar13;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x25].SF_;
      UVar6 = EFLAGS_TABLE[0x25].ZF_;
      UVar7 = EFLAGS_TABLE[0x25].AF_;
      UVar8 = EFLAGS_TABLE[0x25].PF_;
      UVar9 = EFLAGS_TABLE[0x25].CF_;
      UVar10 = EFLAGS_TABLE[0x25].TF_;
      UVar11 = EFLAGS_TABLE[0x25].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x25].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      uVar14 = EFLAGS_TABLE[0x25]._8_4_;
    }
    (pMyDisasm->Instruction).Flags.DF_ = (UInt8)uVar14;
    (pMyDisasm->Instruction).Flags.NT_ = SUB41(uVar14,1);
    (pMyDisasm->Instruction).Flags.RF_ = SUB41(uVar14,2);
    (pMyDisasm->Instruction).Flags.alignment = SUB41(uVar14,3);
  }
  return;
}

Assistant:

void __bea_callspec__ G3_Ev(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    switch (GV.REGOPCODE) {
      case 0:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "test");
        #endif
        EvIv(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ;
        FillFlags(pMyDisasm, 104);
      break;
      case 1:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "test");
        #endif
        EvIv(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ;
        FillFlags(pMyDisasm, 104);
      break;
      case 2:
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+LOGICAL_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "not");
        #endif
        Ev(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        FillFlags(pMyDisasm, 73);
      break;
      case 3:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "neg");
        #endif
        Ev(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        FillFlags(pMyDisasm, 71);
      break;
      case 4:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mul");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 70);
      break;
      case 5:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "imul");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0;
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 38);
      break;
      case 6:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "div");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0+REG2;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 31);
      break;
      case 7:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "idiv");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0+REG2;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 37);
      }
}